

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeFieldWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  FieldType FVar1;
  int iVar2;
  uint32 uVar3;
  LogMessage *pLVar4;
  MessageLite *pMVar5;
  long lVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (this->cached_size != 0) {
        io::CodedOutputStream::WriteVarint32(output,number * 8 + 2);
        io::CodedOutputStream::WriteVarint32(output,this->cached_size);
        FVar1 = this->type;
        if ((byte)(FVar1 - 0x13) < 0xee) {
          LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                     ,0x35);
          pLVar4 = LogMessage::operator<<
                             (&local_60,
                              "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
          LogFinisher::operator=(&local_61,pLVar4);
          LogMessage::~LogMessage(&local_60);
        }
        switch(FVar1) {
        case '\x01':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian64
                        (output,(uint64)pMVar5->_vptr_MessageLite[lVar6]);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x02':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian32
                        (output,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4));
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x03':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteVarint64(output,(uint64)pMVar5->_vptr_MessageLite[lVar6]);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x04':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteVarint64(output,(uint64)pMVar5->_vptr_MessageLite[lVar6]);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x05':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              uVar3 = *(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4);
              if ((long)(int)uVar3 < 0) {
                io::CodedOutputStream::WriteVarint64(output,(long)(int)uVar3);
              }
              else {
                io::CodedOutputStream::WriteVarint32(output,uVar3);
              }
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x06':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian64
                        (output,(uint64)pMVar5->_vptr_MessageLite[lVar6]);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\a':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian32
                        (output,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4));
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\b':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteVarint32
                        (output,(uint)*(byte *)((long)pMVar5->_vptr_MessageLite + lVar6));
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\t':
        case '\n':
        case '\v':
        case '\f':
          LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                     ,0x49d);
          pLVar4 = LogMessage::operator<<(&local_60,"Non-primitive types can\'t be packed.");
          LogFinisher::operator=(&local_61,pLVar4);
          LogMessage::~LogMessage(&local_60);
          break;
        case '\r':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteVarint32
                        (output,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4));
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x0e':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              uVar3 = *(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4);
              if ((long)(int)uVar3 < 0) {
                io::CodedOutputStream::WriteVarint64(output,(long)(int)uVar3);
              }
              else {
                io::CodedOutputStream::WriteVarint32(output,uVar3);
              }
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x0f':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian32
                        (output,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4));
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x10':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteLittleEndian64
                        (output,(uint64)pMVar5->_vptr_MessageLite[lVar6]);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x11':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              iVar2 = *(int *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4);
              io::CodedOutputStream::WriteVarint32(output,iVar2 >> 0x1f ^ iVar2 * 2);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
          break;
        case '\x12':
          pMVar5 = (this->field_0).message_value;
          if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
            lVar6 = 0;
            do {
              io::CodedOutputStream::WriteVarint64
                        (output,(long)pMVar5->_vptr_MessageLite[lVar6] >> 0x3f ^
                                (long)pMVar5->_vptr_MessageLite[lVar6] * 2);
              lVar6 = lVar6 + 1;
              pMVar5 = (this->field_0).message_value;
            } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
          }
        }
      }
    }
    else {
      FVar1 = this->type;
      if ((byte)(FVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                   ,0x35);
        pLVar4 = LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_61,pLVar4);
        LogMessage::~LogMessage(&local_60);
      }
      switch(FVar1) {
      case '\x01':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteDouble(number,(double)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x02':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteFloat
                      (number,*(float *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x03':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteInt64(number,(int64)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x04':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteUInt64(number,(uint64)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x05':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteInt32
                      (number,*(int32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x06':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteFixed64(number,(uint64)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\a':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteFixed32
                      (number,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\b':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteBool
                      (number,*(bool *)((long)pMVar5->_vptr_MessageLite + lVar6),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\t':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteString(number,(string *)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\n':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteGroup
                      (number,(MessageLite *)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\v':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteMessage
                      (number,(MessageLite *)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\f':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteBytes(number,(string *)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\r':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteUInt32
                      (number,*(uint32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x0e':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteEnum
                      (number,*(int *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x0f':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteSFixed32
                      (number,*(int32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x10':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteSFixed64(number,(int64)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x11':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteSInt32
                      (number,*(int32 *)((long)pMVar5->_vptr_MessageLite + lVar6 * 4),output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
        break;
      case '\x12':
        pMVar5 = (this->field_0).message_value;
        if (0 < *(int *)&pMVar5[1]._vptr_MessageLite) {
          lVar6 = 0;
          do {
            WireFormatLite::WriteSInt64(number,(int64)pMVar5->_vptr_MessageLite[lVar6],output);
            lVar6 = lVar6 + 1;
            pMVar5 = (this->field_0).message_value;
          } while (lVar6 < *(int *)&pMVar5[1]._vptr_MessageLite);
        }
      }
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    switch(FVar1) {
    case '\x01':
      WireFormatLite::WriteDouble(number,(this->field_0).double_value,output);
      break;
    case '\x02':
      WireFormatLite::WriteFloat(number,(this->field_0).float_value,output);
      break;
    case '\x03':
      WireFormatLite::WriteInt64(number,(this->field_0).int64_value,output);
      break;
    case '\x04':
      WireFormatLite::WriteUInt64(number,(this->field_0).uint64_value,output);
      break;
    case '\x05':
      WireFormatLite::WriteInt32(number,(this->field_0).int32_value,output);
      break;
    case '\x06':
      WireFormatLite::WriteFixed64(number,(this->field_0).uint64_value,output);
      break;
    case '\a':
      WireFormatLite::WriteFixed32(number,(this->field_0).uint32_value,output);
      break;
    case '\b':
      WireFormatLite::WriteBool(number,(this->field_0).bool_value,output);
      break;
    case '\t':
      WireFormatLite::WriteString(number,(this->field_0).string_value,output);
      break;
    case '\n':
      WireFormatLite::WriteGroup(number,(this->field_0).message_value,output);
      break;
    case '\v':
      pMVar5 = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) == 0) {
        WireFormatLite::WriteMessage(number,pMVar5,output);
      }
      else {
        (*pMVar5->_vptr_MessageLite[0xd])(pMVar5,(ulong)(uint)number,output);
      }
      break;
    case '\f':
      WireFormatLite::WriteBytes(number,(this->field_0).string_value,output);
      break;
    case '\r':
      WireFormatLite::WriteUInt32(number,(this->field_0).uint32_value,output);
      break;
    case '\x0e':
      WireFormatLite::WriteEnum(number,(this->field_0).enum_value,output);
      break;
    case '\x0f':
      WireFormatLite::WriteSFixed32(number,(this->field_0).int32_value,output);
      break;
    case '\x10':
      WireFormatLite::WriteSFixed64(number,(this->field_0).int64_value,output);
      break;
    case '\x11':
      WireFormatLite::WriteSInt32(number,(this->field_0).int32_value,output);
      break;
    case '\x12':
      WireFormatLite::WriteSInt64(number,(this->field_0).int64_value,output);
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeFieldWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return;

      WireFormatLite::WriteTag(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
      output->WriteVarint32(cached_size);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE##NoTag(                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE(number,                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case WireFormatLite::TYPE_##UPPERCASE:                     \
        WireFormatLite::Write##CAMELCASE(number, VALUE, output); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          lazymessage_value->WriteMessage(number, output);
        } else {
          WireFormatLite::WriteMessage(number, *message_value, output);
        }
        break;
    }
  }
}